

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EvalContext.cpp
# Opt level: O0

ConstantValue * __thiscall slang::ast::EvalContext::findLocal(EvalContext *this,ValueSymbol *symbol)

{
  bool bVar1;
  pointer ppVar2;
  map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
  *in_RDI;
  iterator it;
  Frame *frame;
  _Self local_30;
  _Self local_28;
  reference local_20;
  ConstantValue *local_8;
  
  bVar1 = SmallVectorBase<slang::ast::EvalContext::Frame>::empty
                    ((SmallVectorBase<slang::ast::EvalContext::Frame> *)
                     &in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
  if (bVar1) {
    local_8 = (ConstantValue *)0x0;
  }
  else {
    local_20 = SmallVectorBase<slang::ast::EvalContext::Frame>::back
                         ((SmallVectorBase<slang::ast::EvalContext::Frame> *)
                          &in_RDI[1]._M_t._M_impl.super__Rb_tree_header._M_header._M_right);
    local_28._M_node =
         (_Base_ptr)
         std::
         map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
         ::find(in_RDI,(key_type *)0xa25422);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<const_slang::ast::ValueSymbol_*,_slang::ConstantValue,_std::less<const_slang::ast::ValueSymbol_*>,_std::allocator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>_>
         ::end(in_RDI);
    bVar1 = std::operator==(&local_28,&local_30);
    if (bVar1) {
      local_8 = (ConstantValue *)0x0;
    }
    else {
      ppVar2 = std::
               _Rb_tree_iterator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>
               ::operator->((_Rb_tree_iterator<std::pair<const_slang::ast::ValueSymbol_*const,_slang::ConstantValue>_>
                             *)0xa25460);
      local_8 = &ppVar2->second;
    }
  }
  return local_8;
}

Assistant:

ConstantValue* EvalContext::findLocal(const ValueSymbol* symbol) {
    if (stack.empty())
        return nullptr;

    auto& frame = stack.back();
    auto it = frame.temporaries.find(symbol);
    if (it == frame.temporaries.end())
        return nullptr;
    return &it->second;
}